

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O1

int sort(lua_State *L)

{
  int u;
  int iVar1;
  
  luaL_checktype(L,1,5);
  u = luaL_len(L,1);
  luaL_checkstack(L,0x28,"");
  iVar1 = lua_type(L,2);
  if (0 < iVar1) {
    luaL_checktype(L,2,6);
  }
  lua_settop(L,2);
  auxsort(L,1,u);
  return 0;
}

Assistant:

static int sort (lua_State *L) {
  int n = aux_getn(L, 1);
  luaL_checkstack(L, 40, "");  /* assume array is smaller than 2^40 */
  if (!lua_isnoneornil(L, 2))  /* is there a 2nd argument? */
    luaL_checktype(L, 2, LUA_TFUNCTION);
  lua_settop(L, 2);  /* make sure there is two arguments */
  auxsort(L, 1, n);
  return 0;
}